

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::parse::
IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
::~IteratorInput(IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                 *this)

{
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *pIVar1;
  WiderType<Decay<IndexingIterator<const_Reader,_Reader>_&>,_Decay<IndexingIterator<const_Reader,_Reader>_&>_>
  WVar2;
  WiderType<Decay<IndexingIterator<const_Reader,_Reader>_>,_Decay<IndexingIterator<const_Reader,_Reader>_&>_>
  WVar3;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_30 [2];
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *local_10;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *this_local;
  
  if (this->parent !=
      (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *)0x0) {
    local_10 = this;
    WVar2 = max<capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>&,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>&>
                      (&this->pos,&this->best);
    local_30[0].container = WVar2.container;
    local_30[0].index = WVar2.index;
    WVar3 = max<capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>&>
                      (local_30,&this->parent->best);
    pIVar1 = this->parent;
    (pIVar1->best).container = WVar3.container;
    (pIVar1->best).index = WVar3.index;
  }
  return;
}

Assistant:

~IteratorInput() {
    if (parent != nullptr) {
      parent->best = kj::max(kj::max(pos, best), parent->best);
    }
  }